

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

int Wlc_NtkCexResim(Gia_Man_t *pAbs,Abc_Cex_t *p,Vec_Int_t *vFirstTotal,int iBit,Vec_Wrd_t *vRes,
                   int iFrame)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  ulong local_70;
  word Value;
  int nBits;
  int First;
  int Entry;
  int b;
  int k;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObj;
  int iFrame_local;
  Vec_Wrd_t *vRes_local;
  int iBit_local;
  Vec_Int_t *vFirstTotal_local;
  Abc_Cex_t *p_local;
  Gia_Man_t *pAbs_local;
  
  Entry = 0;
  vRes_local._4_4_ = iBit;
  while( true ) {
    iVar3 = Gia_ManPiNum(pAbs);
    bVar7 = false;
    if (Entry < iVar3) {
      pObjRi = Gia_ManCi(pAbs,Entry);
      bVar7 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar5 = Abc_InfoHasBit((uint *)(p + 1),vRes_local._4_4_);
    *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
    Entry = Entry + 1;
    vRes_local._4_4_ = vRes_local._4_4_ + 1;
  }
  Entry = 0;
  while( true ) {
    bVar7 = false;
    if (Entry < pAbs->nObjs) {
      pObjRi = Gia_ManObj(pAbs,Entry);
      bVar7 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar3 = Gia_ObjIsAnd(pObjRi);
    if (iVar3 != 0) {
      pGVar6 = Gia_ObjFanin0(pObjRi);
      uVar2 = *(ulong *)pGVar6;
      uVar5 = Gia_ObjFaninC0(pObjRi);
      pGVar6 = Gia_ObjFanin1(pObjRi);
      uVar1 = *(ulong *)pGVar6;
      uVar4 = Gia_ObjFaninC1(pObjRi);
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xffffffffbfffffff |
           ((ulong)(((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & ((uint)(uVar1 >> 0x1e) & 1 ^ uVar4)) & 1)
           << 0x1e;
    }
    Entry = Entry + 1;
  }
  Entry = 0;
  while( true ) {
    iVar3 = Vec_IntSize(pAbs->vCos);
    bVar7 = false;
    if (Entry < iVar3) {
      pObjRi = Gia_ManCo(pAbs,Entry);
      bVar7 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    pGVar6 = Gia_ObjFanin0(pObjRi);
    uVar2 = *(ulong *)pGVar6;
    uVar5 = Gia_ObjFaninC0(pObjRi);
    *(ulong *)pObjRi =
         *(ulong *)pObjRi & 0xffffffffbfffffff |
         ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & 1) << 0x1e;
    Entry = Entry + 1;
  }
  Entry = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(pAbs);
    bVar7 = false;
    if (Entry < iVar3) {
      iVar3 = Gia_ManPoNum(pAbs);
      pObjRo = Gia_ManCo(pAbs,iVar3 + Entry);
      bVar7 = false;
      if (pObjRo != (Gia_Obj_t *)0x0) {
        iVar3 = Gia_ManPiNum(pAbs);
        _b = Gia_ManCi(pAbs,iVar3 + Entry);
        bVar7 = _b != (Gia_Obj_t *)0x0;
      }
    }
    if (!bVar7) break;
    *(ulong *)_b = *(ulong *)_b & 0xffffffffbfffffff |
                   (ulong)((uint)(*(ulong *)pObjRo >> 0x1e) & 1) << 0x1e;
    Entry = Entry + 1;
  }
  Entry = 0;
  do {
    iVar3 = Vec_IntSize(vFirstTotal);
    if (iVar3 <= Entry) {
      return vRes_local._4_4_;
    }
    uVar5 = Vec_IntEntry(vFirstTotal,Entry);
    if (uVar5 == 0) {
      iVar3 = Vec_IntSize(vFirstTotal);
      Vec_WrdWriteEntry(vRes,iVar3 * iFrame + Entry,0xffffffffffffffff);
    }
    else {
      iVar3 = Gia_ManCiNum(pAbs);
      if (iVar3 <= (int)uVar5 >> 10) {
        __assert_fail("First < Gia_ManCiNum(pAbs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                      ,0x2e4,
                      "int Wlc_NtkCexResim(Gia_Man_t *, Abc_Cex_t *, Vec_Int_t *, int, Vec_Wrd_t *, int)"
                     );
      }
      if (0x40 < (uVar5 & 0x3ff)) {
        __assert_fail("nBits <= 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                      ,0x2e6,
                      "int Wlc_NtkCexResim(Gia_Man_t *, Abc_Cex_t *, Vec_Int_t *, int, Vec_Wrd_t *, int)"
                     );
      }
      local_70 = 0;
      for (First = 0; First < (int)(uVar5 & 0x3ff); First = First + 1) {
        pGVar6 = Gia_ManCi(pAbs,((int)uVar5 >> 10) + First);
        if ((*(ulong *)pGVar6 >> 0x1e & 1) != 0) {
          local_70 = 1L << ((byte)First & 0x3f) | local_70;
        }
      }
      iVar3 = Vec_IntSize(vFirstTotal);
      Vec_WrdWriteEntry(vRes,iVar3 * iFrame + Entry,local_70);
    }
    Entry = Entry + 1;
  } while( true );
}

Assistant:

int Wlc_NtkCexResim( Gia_Man_t * pAbs, Abc_Cex_t * p, Vec_Int_t * vFirstTotal, int iBit, Vec_Wrd_t * vRes, int iFrame )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo; 
    int k, b, Entry, First, nBits; word Value;
    // assuming that flop outputs have been assigned in the previous timeframe
    // assign primary inputs
    Gia_ManForEachPi( pAbs, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    // simulate
    Gia_ManForEachAnd( pAbs, pObj, k )
        pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                       (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
    // transfer to combinational outputs
    Gia_ManForEachCo( pAbs, pObj, k )
        pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    // transfer values to flop outputs
    Gia_ManForEachRiRo( pAbs, pObjRi, pObjRo, k )
        pObjRo->fMark0 = pObjRi->fMark0;
    // at this point PIs and FOs area assigned according to this time-frame
    // collect values
    Vec_IntForEachEntry( vFirstTotal, Entry, k )
    {
        if ( Entry == 0 )
        {
            Vec_WrdWriteEntry( vRes, Vec_IntSize(vFirstTotal)*iFrame + k, ~(word)0 );
            continue;
        }
        First = Entry >> 10;
        assert( First < Gia_ManCiNum(pAbs) );
        nBits = Entry & 0x3FF;
        assert( nBits <= 64 );
        Value = 0;
        for ( b = 0; b < nBits; b++ )
            if ( Gia_ManCi(pAbs, First+b)->fMark0 )
                Value |= ((word)1) << b;
        Vec_WrdWriteEntry( vRes, Vec_IntSize(vFirstTotal)*iFrame + k, Value );
    }
    return iBit;
}